

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void __thiscall OjaNewton::initialize_Z(OjaNewton *this,parameters *weights)

{
  weight *pwVar1;
  int j_1;
  size_t sVar2;
  uint32_t i;
  size_t index;
  long lVar3;
  ulong uVar4;
  int j;
  long lVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  
  sVar2 = 1;
  uVar4 = 1L << ((byte)this->all->num_bits & 0x3f);
  if (this->normalize == true) {
    for (index = 0; uVar4 != index; index = index + 1) {
      pwVar1 = parameters::strided_index(weights,index);
      pwVar1[(long)this->m + 1] = 0.1;
    }
  }
  uVar4 = uVar4 & 0xffffffff;
  if (this->random_init == false) {
    for (; (long)sVar2 <= (long)this->m; sVar2 = sVar2 + 1) {
      pwVar1 = parameters::strided_index(weights,sVar2);
      pwVar1[sVar2] = 1.0;
    }
  }
  else {
    for (sVar2 = 0; sVar2 != uVar4; sVar2 = sVar2 + 1) {
      pwVar1 = parameters::strided_index(weights,sVar2);
      for (lVar5 = 1; lVar5 <= this->m; lVar5 = lVar5 + 1) {
        do {
          fVar6 = merand48(&this->all->random_state);
          fVar7 = merand48(&this->all->random_state);
        } while (fVar6 == 0.0);
        fVar6 = logf(fVar6);
        fVar6 = fVar6 * -2.0;
        if (fVar6 < 0.0) {
          fVar6 = sqrtf(fVar6);
        }
        else {
          fVar6 = SQRT(fVar6);
        }
        dVar8 = cos((double)fVar7 * 6.2831854820251465);
        pwVar1[lVar5] = (float)dVar8 * fVar6;
      }
    }
  }
  for (lVar5 = 1; lVar5 <= this->m; lVar5 = lVar5 + 1) {
    lVar3 = 1;
    while( true ) {
      dVar8 = 0.0;
      sVar2 = 0;
      if (lVar3 == lVar5) break;
      for (; uVar4 != sVar2; sVar2 = sVar2 + 1) {
        pwVar1 = parameters::strided_index(weights,sVar2);
        fVar6 = pwVar1[lVar5];
        pwVar1 = parameters::strided_index(weights,sVar2);
        dVar8 = dVar8 + (double)pwVar1[lVar3] * (double)fVar6;
      }
      for (sVar2 = 0; uVar4 != sVar2; sVar2 = sVar2 + 1) {
        pwVar1 = parameters::strided_index(weights,sVar2);
        fVar6 = pwVar1[lVar3];
        pwVar1 = parameters::strided_index(weights,sVar2);
        pwVar1[lVar5] = fVar6 * -(float)dVar8 + pwVar1[lVar5];
      }
      lVar3 = lVar3 + 1;
    }
    for (; uVar4 != sVar2; sVar2 = sVar2 + 1) {
      pwVar1 = parameters::strided_index(weights,sVar2);
      fVar6 = pwVar1[lVar5];
      pwVar1 = parameters::strided_index(weights,sVar2);
      dVar8 = dVar8 + (double)pwVar1[lVar5] * (double)fVar6;
    }
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    for (sVar2 = 0; uVar4 != sVar2; sVar2 = sVar2 + 1) {
      pwVar1 = parameters::strided_index(weights,sVar2);
      pwVar1[lVar5] = pwVar1[lVar5] / (float)dVar8;
    }
  }
  return;
}

Assistant:

void initialize_Z(parameters& weights)
  {
    uint32_t length = 1 << all->num_bits;
    if (normalize)  // initialize normalization part
    {
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[NORM2] = 0.1f;
    }
    if (!random_init)
    {
      // simple initialization
      for (int i = 1; i <= m; i++) (&(weights.strided_index(i)))[i] = 1.f;
    }
    else
    {
      // more complicated initialization: orthgonal basis of a random matrix

      const double PI2 = 2.f * 3.1415927f;

      for (uint32_t i = 0; i < length; i++)
      {
        weight& w = weights.strided_index(i);
        float r1, r2;
        for (int j = 1; j <= m; j++)
        {
          //box-muller tranform: https://en.wikipedia.org/wiki/Box%E2%80%93Muller_transform
          //redraw until r1 should be strictly positive
          do
          {
            r1 = merand48(all->random_state);
            r2 = merand48(all->random_state);
          } while (r1 == 0.f);

          (&w)[j] = sqrt(-2.f * log(r1)) * (float)cos(PI2 * r2);
        }
      }
    }

    // Gram-Schmidt
    for (int j = 1; j <= m; j++)
    {
      for (int k = 1; k <= j - 1; k++)
      {
        double tmp = 0;

        for (uint32_t i = 0; i < length; i++)
          tmp += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[k];
        for (uint32_t i = 0; i < length; i++)
          (&(weights.strided_index(i)))[j] -= (float)tmp * (&(weights.strided_index(i)))[k];
      }
      double norm = 0;
      for (uint32_t i = 0; i < length; i++)
        norm += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[j];
      norm = sqrt(norm);
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[j] /= (float)norm;
    }
  }